

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.c
# Opt level: O1

int color_from_gradient(gradient_t *gradient,float pos,pixel_color_t *color)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  gradient_color_t *left;
  gradient_color_t *right;
  
  bVar2 = gradient->num_colors < 2;
  if (1 < gradient->num_colors) {
    lVar3 = 1;
    lVar4 = 0x10;
    left = gradient->colors;
    do {
      right = (gradient_color_t *)((long)&gradient->colors->pos + lVar4);
      bVar1 = true;
      if ((left->pos <= pos) && (pos <= right->pos)) {
        color_from_gradient_range(left,right,pos,color);
        bVar1 = false;
        right = left;
      }
      if (!bVar1) break;
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x10;
      bVar2 = gradient->num_colors <= lVar3;
      left = right;
    } while (lVar3 < gradient->num_colors);
  }
  return -(uint)bVar2;
}

Assistant:

int color_from_gradient(const gradient_t *gradient, float pos, pixel_color_t *color)
{
    gradient_color_t *left = &gradient->colors[0];

    for (int i = 1; i < gradient->num_colors; ++i) {
        gradient_color_t *right = &gradient->colors[i];

        if (pos >= left->pos && pos <= right->pos) {
            color_from_gradient_range(left, right, pos, color);
            return 0;
        }

        left = right;
    }

    return -1;
}